

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.cpp
# Opt level: O0

int uv11::getaddrinfo(char *__name,char *__service,addrinfo *__req,addrinfo **__pai)

{
  uv_loop_t *puVar1;
  uv_getaddrinfo_s *puVar2;
  _func_void_uv_getaddrinfo_t_ptr_int_addrinfo_ptr *p_Var3;
  addrinfo *in_R8;
  undefined8 in_R9;
  error_code eVar4;
  __0 local_4d;
  int local_4c;
  undefined8 uStack_48;
  int s;
  addrinfo *hints_local;
  char *service_local;
  char *node_local;
  GetAddrInfoCb *callback_local;
  GetAddrInfoRequest *req_local;
  Loop *loop_local;
  
  uStack_48 = in_R9;
  hints_local = in_R8;
  service_local = (char *)__pai;
  node_local = (char *)__req;
  callback_local = (GetAddrInfoCb *)__service;
  req_local = (GetAddrInfoRequest *)__name;
  std::function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)>::operator=
            ((function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)> *)
             (__service + 0xa8),
             (function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)> *)
             __req);
  puVar1 = Loop::Get((Loop *)req_local);
  puVar2 = WrappedObject<uv_getaddrinfo_s>::Get((WrappedObject<uv_getaddrinfo_s> *)callback_local);
  p_Var3 = getaddrinfo(uv11::Loop&,uv11::GetAddrInfoRequest&,std::function_const&,char_const*,char_const*,addrinfo&)
           ::$_0::operator_cast_to_function_pointer(&local_4d);
  local_4c = uv_getaddrinfo(puVar1,puVar2,p_Var3,service_local,hints_local,uStack_48);
  eVar4 = make_error(local_4c);
  return eVar4._M_value;
}

Assistant:

Error uv11::getaddrinfo(
    Loop& loop,
    GetAddrInfoRequest& req,
    GetAddrInfoCb const& callback,
    char const* node, char const* service,
    addrinfo& hints
) {
    req.getaddrinfo_cb = callback;
    int s = ::uv_getaddrinfo(
        &loop.Get(),
        &req.Get(),
        [](uv_getaddrinfo_t* req_ptr, int status, struct addrinfo* res){
            GetAddrInfoRequest* r = reinterpret_cast<GetAddrInfoRequest*>(req_ptr->data);
            r->getaddrinfo_cb(*r, make_error(status), UvAddrInfoPtr(res));
        },
        node, service,
        &hints
    );

    return make_error(s);
}